

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar4 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  cmTarget *pcVar6;
  cmTargetInternalPointer *pcVar7;
  int iVar8;
  cmTargetInternals *__s;
  string *psVar9;
  char *__s_00;
  cmGlobalGenerator *pcVar10;
  size_t sVar11;
  long *plVar12;
  size_type *psVar13;
  pointer pbVar14;
  pointer pbVar15;
  long lVar16;
  cmStringRange cVar17;
  cmBacktraceRange cVar18;
  string configUpper;
  string property;
  string propValue;
  string propName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [2];
  cmTarget *local_130;
  string local_128;
  cmTargetInternalPointer *local_108;
  cmMakefile *local_100;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_f8;
  string *local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->SystemIncludeDirectories;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_f0 = (string *)&this->Name;
  local_78 = &(this->Name).field_2;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[0] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[2] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[4] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)local_78;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->InstallPath).field_2;
  (this->InstallPath)._M_dataplus._M_p = (pointer)local_80;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  local_88 = &(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)local_88;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = this;
  __s = (cmTargetInternals *)operator_new(0x180);
  memset(__s,0,0x180);
  (this->Internal).Pointer = __s;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = mf;
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  local_108 = &this->Internal;
  this->IsGeneratorProvided = false;
  std::__cxx11::string::_M_assign(local_f0);
  pcVar3 = local_100;
  this->TargetTypeValue = type;
  this->Makefile = local_100;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = vis - VisibilityImported < 2;
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;
  local_168 = (undefined1  [8])local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_168);
  this->DLLPlatform = psVar9->_M_string_length != 0;
  if (local_168 != (undefined1  [8])local_158) {
    operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  local_168 = (undefined1  [8])local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CMAKE_SYSTEM_NAME","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_168);
  iVar8 = std::__cxx11::string::compare((char *)psVar9);
  this->IsAndroid = iVar8 == 0;
  if (local_168 != (undefined1  [8])local_158) {
    operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_API","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_API_MIN","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_ARCH","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_STL_TYPE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_SKIP_ANT_STEP","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_PROCESS_MAX","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_PROGUARD","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_PROGUARD_CONFIG_PATH","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_SECURE_PROPS_PATH","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_NATIVE_LIB_DIRECTORIES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_JAVA_SOURCE_DIR","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_JAR_DIRECTORIES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_JAR_DEPENDENCIES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_ASSETS_DIRECTORIES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"BUILD_RPATH","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"BUILD_RPATH_USE_ORIGIN","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"INSTALL_NAME_DIR","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"INSTALL_RPATH","");
    SetPropertyDefault(this,(string *)local_168,"");
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"INSTALL_RPATH_USE_LINK_PATH","");
    SetPropertyDefault(this,(string *)local_168,"OFF");
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"INTERPROCEDURAL_OPTIMIZATION","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"SKIP_BUILD_RPATH","");
    SetPropertyDefault(this,(string *)local_168,"OFF");
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"BUILD_WITH_INSTALL_RPATH","");
    SetPropertyDefault(this,(string *)local_168,"OFF");
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"ARCHIVE_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"LIBRARY_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"RUNTIME_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"COMPILE_PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Fortran_FORMAT","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Fortran_MODULE_DIRECTORY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Fortran_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GNUtoMS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"OSX_ARCHITECTURES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"IOS_INSTALL_COMBINED","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOMOC","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOUIC","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTORCC","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOGEN_ORIGIN_DEPENDS","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOGEN_PARALLEL","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"AUTOMOC_COMPILER_PREDEFINES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOMOC_DEPEND_FILTERS","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOMOC_MACRO_NAMES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOMOC_MOC_OPTIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOUIC_OPTIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTOUIC_SEARCH_PATHS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AUTORCC_OPTIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"LINK_DEPENDS_NO_SHARED","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"LINK_INTERFACE_LIBRARIES","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"WIN32_EXECUTABLE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"MACOSX_BUNDLE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"MACOSX_RPATH","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"NO_SYSTEM_FROM_IMPORTED","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"BUILD_WITH_INSTALL_NAME_DIR","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_CLANG_TIDY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_CPPLINT","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_CPPCHECK","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_INCLUDE_WHAT_YOU_USE","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"LINK_WHAT_YOU_USE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_STANDARD","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_STANDARD_REQUIRED","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_EXTENSIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_CLANG_TIDY","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_CPPLINT","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_CPPCHECK","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"CXX_INCLUDE_WHAT_YOU_USE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_STANDARD","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_STANDARD_REQUIRED","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_EXTENSIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CUDA_STANDARD","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CUDA_STANDARD_REQUIRED","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CUDA_EXTENSIONS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CUDA_COMPILER_LAUNCHER","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"CUDA_SEPARABLE_COMPILATION","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"LINK_SEARCH_START_STATIC","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"LINK_SEARCH_END_STATIC","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"FOLDER","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,local_100,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this->TargetTypeValue != UTILITY) {
    local_70 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::UpperCase((string *)local_168,pbVar14);
        lVar16 = 0;
        do {
          if (local_130->TargetTypeValue == INTERFACE_LIBRARY) {
            iVar8 = strcmp(*(char **)((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*)
                                             ::configProps + lVar16),"MAP_IMPORTED_CONFIG_");
            if (iVar8 == 0) goto LAB_001fcc84;
          }
          else {
LAB_001fcc84:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_128,
                       *(char **)((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*)
                                         ::configProps + lVar16),(allocator<char> *)&local_c8);
            std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_168);
            SetPropertyDefault(local_130,&local_128,(char *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          this = local_130;
          lVar16 = lVar16 + 8;
        } while (lVar16 != 0x38);
        if ((local_130->TargetTypeValue != EXECUTABLE) &&
           (local_130->TargetTypeValue != INTERFACE_LIBRARY)) {
          cmsys::SystemTools::UpperCase(&local_128,pbVar14);
          std::__cxx11::string::append((char *)&local_128);
          SetPropertyDefault(this,&local_128,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_168 != (undefined1  [8])local_158) {
          operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
        }
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != local_70);
    }
  }
  cmMakefile::GetBacktrace(this->Makefile);
  p_Var5 = p_Stack_160;
  auVar4 = local_168;
  local_168 = (undefined1  [8])0x0;
  p_Stack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar4;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
  }
  if (this->IsImportedTarget == false) {
    cVar17 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar18 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    pcVar7 = local_108;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_108->Pointer,
               (local_108->Pointer->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar7->Pointer->IncludeDirectoriesBacktraces,
               (pcVar7->Pointer->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
               cVar18.End._M_current._M_current);
    pcVar6 = local_130;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168,&(local_130->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              (local_f8,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_158[0]._8_8_,(_Base_ptr)&p_Stack_160);
    cVar17 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(pcVar6->Makefile);
    cVar18 = cmMakefile::GetCompileOptionsBacktraces(pcVar6->Makefile);
    pcVar7 = local_108;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_108->Pointer->CompileOptionsEntries,
               (local_108->Pointer->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar7->Pointer->CompileOptionsBacktraces,
               (pcVar7->Pointer->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
               cVar18.End._M_current._M_current);
    pcVar6 = local_130;
    cVar17 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_(local_130->Makefile);
    cVar18 = cmMakefile::GetLinkOptionsBacktraces(pcVar6->Makefile);
    pcVar7 = local_108;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_108->Pointer->LinkOptionsEntries,
               (local_108->Pointer->LinkOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar7->Pointer->LinkOptionsBacktraces,
               (pcVar7->Pointer->LinkOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
               cVar18.End._M_current._M_current);
    pcVar6 = local_130;
    cVar17 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_(local_130->Makefile);
    cVar18 = cmMakefile::GetLinkDirectoriesBacktraces(pcVar6->Makefile);
    pcVar7 = local_108;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_108->Pointer->LinkDirectoriesEntries,
               (local_108->Pointer->LinkDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar17.Begin._M_current._M_current,
               cVar17.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar7->Pointer->LinkDirectoriesBacktraces,
               (pcVar7->Pointer->LinkDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar18.Begin._M_current._M_current,
               cVar18.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
    this = local_130;
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"C_VISIBILITY_PRESET","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CXX_VISIBILITY_PRESET","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CUDA_VISIBILITY_PRESET","")
    ;
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"VISIBILITY_INLINES_HIDDEN","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  if (this->TargetTypeValue == EXECUTABLE) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ANDROID_GUI","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"CROSSCOMPILING_EMULATOR","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ENABLE_EXPORTS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"POSITION_INDEPENDENT_CODE","");
    SetProperty(this,(string *)local_168,"True");
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetTypeValue & ~SHARED_LIBRARY) == EXECUTABLE) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"POSITION_INDEPENDENT_CODE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"JOB_POOL_COMPILE","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"JOB_POOL_LINK","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  if ((int)this->TargetTypeValue < 6) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"DOTNET_TARGET_FRAMEWORK_VERSION","");
    SetPropertyDefault(this,(string *)local_168,(char *)0x0);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CMAKE_VS_GLOBALS","");
    __s_00 = cmMakefile::GetDefinition(local_100,(string *)local_168);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
    }
    if (__s_00 != (char *)0x0) {
      pcVar10 = cmMakefile::GetGlobalGenerator(local_100);
      (*pcVar10->_vptr_cmGlobalGenerator[3])(local_168,pcVar10);
      iVar8 = strncmp((char *)local_168,"Visual Studio",0xd);
      if (iVar8 == 0) {
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paVar2 = &local_128.field_2;
        local_128._M_dataplus._M_p = (pointer)paVar2;
        sVar11 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,__s_00,__s_00 + sVar11)
        ;
        cmSystemTools::ExpandListArgument(&local_128,&local_a8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        local_128._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"VS_GLOBAL_","");
        pbVar14 = local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar15 = local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar16 = std::__cxx11::string::find((char)pbVar15,0x3d);
            if (lVar16 != -1) {
              std::__cxx11::string::substr((ulong)local_e8,(ulong)pbVar15);
              plVar12 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_e8,0,(char *)0x0,
                                           (ulong)local_128._M_dataplus._M_p);
              psVar13 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_c8.field_2._M_allocated_capacity = *psVar13;
                local_c8.field_2._8_8_ = plVar12[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar13;
                local_c8._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_c8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (local_e8[0] != local_d8) {
                operator_delete(local_e8[0],local_d8[0] + 1);
              }
              std::__cxx11::string::substr((ulong)local_e8,(ulong)pbVar15);
              SetPropertyDefault(local_130,&local_c8,(char *)local_e8[0]);
              if (local_e8[0] != local_d8) {
                operator_delete(local_e8[0],local_d8[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar14);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
      }
      if (local_168 != (undefined1  [8])local_158) {
        operator_delete((void *)local_168,local_158[0]._M_allocated_capacity + 1);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->IsGeneratorProvided = false;
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    !this->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    (this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME") == "Android");

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", nullptr);
    this->SetPropertyDefault("ANDROID_API_MIN", nullptr);
    this->SetPropertyDefault("ANDROID_ARCH", nullptr);
    this->SetPropertyDefault("ANDROID_STL_TYPE", nullptr);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", nullptr);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", nullptr);
    this->SetPropertyDefault("ANDROID_PROGUARD", nullptr);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", nullptr);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", nullptr);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", nullptr);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", nullptr);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", nullptr);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", nullptr);
    this->SetPropertyDefault("BUILD_RPATH", nullptr);
    this->SetPropertyDefault("BUILD_RPATH_USE_ORIGIN", nullptr);
    this->SetPropertyDefault("INSTALL_NAME_DIR", nullptr);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", nullptr);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("Fortran_FORMAT", nullptr);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", nullptr);
    this->SetPropertyDefault("Fortran_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("GNUtoMS", nullptr);
    this->SetPropertyDefault("OSX_ARCHITECTURES", nullptr);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", nullptr);
    this->SetPropertyDefault("AUTOMOC", nullptr);
    this->SetPropertyDefault("AUTOUIC", nullptr);
    this->SetPropertyDefault("AUTORCC", nullptr);
    this->SetPropertyDefault("AUTOGEN_ORIGIN_DEPENDS", nullptr);
    this->SetPropertyDefault("AUTOGEN_PARALLEL", nullptr);
    this->SetPropertyDefault("AUTOMOC_COMPILER_PREDEFINES", nullptr);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", nullptr);
    this->SetPropertyDefault("AUTOMOC_MACRO_NAMES", nullptr);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", nullptr);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", nullptr);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", nullptr);
    this->SetPropertyDefault("AUTORCC_OPTIONS", nullptr);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", nullptr);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", nullptr);
    this->SetPropertyDefault("WIN32_EXECUTABLE", nullptr);
    this->SetPropertyDefault("MACOSX_BUNDLE", nullptr);
    this->SetPropertyDefault("MACOSX_RPATH", nullptr);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", nullptr);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", nullptr);
    this->SetPropertyDefault("C_CLANG_TIDY", nullptr);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("C_CPPLINT", nullptr);
    this->SetPropertyDefault("C_CPPCHECK", nullptr);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("C_STANDARD", nullptr);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("C_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CXX_CLANG_TIDY", nullptr);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("CXX_CPPLINT", nullptr);
    this->SetPropertyDefault("CXX_CPPCHECK", nullptr);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("CXX_STANDARD", nullptr);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("CXX_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CUDA_STANDARD", nullptr);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("CUDA_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("CUDA_SEPARABLE_COMPILATION", nullptr);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", nullptr);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", nullptr);
    this->SetPropertyDefault("FOLDER", nullptr);
#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      this->SetPropertyDefault("XCODE_SCHEME_ADDRESS_SANITIZER", nullptr);
      this->SetPropertyDefault(
        "XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_THREAD_SANITIZER", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_THREAD_SANITIZER_STOP", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER",
                               nullptr);
      this->SetPropertyDefault(
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_SCRIBBLE", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_GUARD_EDGES", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_GUARD_MALLOC", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_ZOMBIE_OBJECTS", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_STACK", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS", nullptr);
    }
#endif
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = prop;
        property += configUpper;
        this->SetPropertyDefault(property, nullptr);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(configName);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, nullptr);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentCompileOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentCompileOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(),
      parentCompileOptions.begin(), parentCompileOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(),
      parentCompileOptionsBts.begin(), parentCompileOptionsBts.end());

    const cmStringRange parentLinkOptions =
      this->Makefile->GetLinkOptionsEntries();
    const cmBacktraceRange parentLinkOptionsBts =
      this->Makefile->GetLinkOptionsBacktraces();

    this->Internal->LinkOptionsEntries.insert(
      this->Internal->LinkOptionsEntries.end(), parentLinkOptions.begin(),
      parentLinkOptions.end());
    this->Internal->LinkOptionsBacktraces.insert(
      this->Internal->LinkOptionsBacktraces.end(),
      parentLinkOptionsBts.begin(), parentLinkOptionsBts.end());

    const cmStringRange parentLinkDirectories =
      this->Makefile->GetLinkDirectoriesEntries();
    const cmBacktraceRange parentLinkDirectoriesBts =
      this->Makefile->GetLinkDirectoriesBacktraces();

    this->Internal->LinkDirectoriesEntries.insert(
      this->Internal->LinkDirectoriesEntries.end(),
      parentLinkDirectories.begin(), parentLinkDirectories.end());
    this->Internal->LinkDirectoriesBacktraces.insert(
      this->Internal->LinkDirectoriesBacktraces.end(),
      parentLinkDirectoriesBts.begin(), parentLinkDirectoriesBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", nullptr);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", nullptr);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", nullptr);
    this->SetPropertyDefault("ENABLE_EXPORTS", nullptr);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", nullptr);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", nullptr);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", nullptr);
    this->SetPropertyDefault("JOB_POOL_LINK", nullptr);
  }

  if (this->TargetTypeValue <= cmStateEnums::UTILITY) {
    this->SetPropertyDefault("DOTNET_TARGET_FRAMEWORK_VERSION", nullptr);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {

    // check for "CMAKE_VS_GLOBALS" variable and set up target properties
    // if any
    const char* globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
    if (globals) {
      const std::string genName = mf->GetGlobalGenerator()->GetName();
      if (cmHasLiteralPrefix(genName, "Visual Studio")) {
        std::vector<std::string> props;
        cmSystemTools::ExpandListArgument(globals, props);
        const std::string vsGlobal = "VS_GLOBAL_";
        for (const std::string& i : props) {
          // split NAME=VALUE
          const std::string::size_type assignment = i.find('=');
          if (assignment != std::string::npos) {
            const std::string propName = vsGlobal + i.substr(0, assignment);
            const std::string propValue = i.substr(assignment + 1);
            this->SetPropertyDefault(propName, propValue.c_str());
          }
        }
      }
    }
  }
}